

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonAppendString(JsonString *p,char *zIn,u32 N)

{
  u64 uVar1;
  int iVar2;
  byte local_21;
  uint local_20;
  uchar c;
  u32 i;
  u32 N_local;
  char *zIn_local;
  JsonString *p_local;
  
  if (((ulong)N + p->nUsed + 2 < p->nAlloc) || (iVar2 = jsonGrow(p,N + 2), iVar2 == 0)) {
    uVar1 = p->nUsed;
    p->nUsed = uVar1 + 1;
    p->zBuf[uVar1] = '\"';
    for (local_20 = 0; local_20 < N; local_20 = local_20 + 1) {
      local_21 = zIn[local_20];
      if ((local_21 == 0x22) || (local_21 == 0x5c)) {
LAB_00219c88:
        if ((p->nAlloc < (p->nUsed + (ulong)N + 3) - (ulong)local_20) &&
           (iVar2 = jsonGrow(p,(N + 3) - local_20), iVar2 != 0)) {
          return;
        }
        uVar1 = p->nUsed;
        p->nUsed = uVar1 + 1;
        p->zBuf[uVar1] = '\\';
      }
      else if (local_21 < 0x20) {
        if (""[local_21] != '\0') {
          local_21 = ""[local_21];
          goto LAB_00219c88;
        }
        if ((p->nAlloc < p->nUsed + (ulong)N + 7 + (ulong)local_20) &&
           (iVar2 = jsonGrow(p,(N + 7) - local_20), iVar2 != 0)) {
          return;
        }
        uVar1 = p->nUsed;
        p->nUsed = uVar1 + 1;
        p->zBuf[uVar1] = '\\';
        uVar1 = p->nUsed;
        p->nUsed = uVar1 + 1;
        p->zBuf[uVar1] = 'u';
        uVar1 = p->nUsed;
        p->nUsed = uVar1 + 1;
        p->zBuf[uVar1] = '0';
        uVar1 = p->nUsed;
        p->nUsed = uVar1 + 1;
        p->zBuf[uVar1] = '0';
        uVar1 = p->nUsed;
        p->nUsed = uVar1 + 1;
        p->zBuf[uVar1] = (char)((int)(uint)local_21 >> 4) + '0';
        local_21 = "0123456789abcdef"[(int)(local_21 & 0xf)];
      }
      uVar1 = p->nUsed;
      p->nUsed = uVar1 + 1;
      p->zBuf[uVar1] = local_21;
    }
    uVar1 = p->nUsed;
    p->nUsed = uVar1 + 1;
    p->zBuf[uVar1] = '\"';
  }
  return;
}

Assistant:

static void jsonAppendString(JsonString *p, const char *zIn, u32 N){
  u32 i;
  if( (N+p->nUsed+2 >= p->nAlloc) && jsonGrow(p,N+2)!=0 ) return;
  p->zBuf[p->nUsed++] = '"';
  for(i=0; i<N; i++){
    unsigned char c = ((unsigned const char*)zIn)[i];
    if( c=='"' || c=='\\' ){
      json_simple_escape:
      if( (p->nUsed+N+3-i > p->nAlloc) && jsonGrow(p,N+3-i)!=0 ) return;
      p->zBuf[p->nUsed++] = '\\';
    }else if( c<=0x1f ){
      static const char aSpecial[] = {
         0, 0, 0, 0, 0, 0, 0, 0, 'b', 't', 'n', 0, 'f', 'r', 0, 0,
         0, 0, 0, 0, 0, 0, 0, 0,   0,   0,   0, 0,   0,   0, 0, 0
      };
      assert( sizeof(aSpecial)==32 );
      assert( aSpecial['\b']=='b' );
      assert( aSpecial['\f']=='f' );
      assert( aSpecial['\n']=='n' );
      assert( aSpecial['\r']=='r' );
      assert( aSpecial['\t']=='t' );
      if( aSpecial[c] ){
        c = aSpecial[c];
        goto json_simple_escape;
      }
      if( (p->nUsed+N+7+i > p->nAlloc) && jsonGrow(p,N+7-i)!=0 ) return;
      p->zBuf[p->nUsed++] = '\\';
      p->zBuf[p->nUsed++] = 'u';
      p->zBuf[p->nUsed++] = '0';
      p->zBuf[p->nUsed++] = '0';
      p->zBuf[p->nUsed++] = '0' + (c>>4);
      c = "0123456789abcdef"[c&0xf];
    }
    p->zBuf[p->nUsed++] = c;
  }
  p->zBuf[p->nUsed++] = '"';
  assert( p->nUsed<p->nAlloc );
}